

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

void __thiscall cfd::Psbt::Psbt(Psbt *this,string *base64)

{
  string *in_RSI;
  Psbt *in_RDI;
  
  core::Psbt::Psbt(in_RDI,in_RSI);
  in_RDI->_vptr_Psbt = (_func_int **)&PTR__Psbt_009efca8;
  std::
  set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>::
  set((set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
       *)0x51bdec);
  return;
}

Assistant:

Psbt::Psbt(const std::string& base64) : cfd::core::Psbt(base64) {}